

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestTestHandler::AddTest
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  bool collapse;
  pointer pbVar9;
  cmCTestTestProperties test;
  ostringstream cmCTestLog_msg_3;
  long *local_368;
  long local_358 [2];
  undefined1 local_348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Alloc_hider local_328;
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308 [2];
  ios_base local_2d8 [128];
  _Rb_tree_node_base local_258;
  size_t local_238;
  ushort local_230;
  undefined8 local_22c;
  bool local_224;
  double local_220;
  bool local_218;
  undefined8 local_210;
  pointer local_208;
  pointer pbStack_200;
  pointer local_1f8;
  pointer pbStack_1f0;
  pointer local_1e8;
  pointer pbStack_1e0;
  _Rb_tree_node_base local_1d0;
  size_t local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"Add test: ",10);
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_348,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x8dd,(char *)local_1a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  if (((this->UseExcludeRegExpFlag != true) || (this->UseExcludeRegExpFirst != true)) ||
     (bVar6 = cmsys::RegularExpression::find
                        (&this->ExcludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p), !bVar6))
  {
    pbVar9 = (this->CustomTestsIgnore).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->CustomTestsIgnore).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this->MemCheck == true) {
      if (pbVar9 != pbVar3) {
        sVar4 = pbVar1->_M_string_length;
        do {
          sVar5 = pbVar9->_M_string_length;
          if ((sVar5 == sVar4) &&
             ((sVar5 == 0 ||
              (iVar7 = bcmp((pbVar9->_M_dataplus)._M_p,(pbVar1->_M_dataplus)._M_p,sVar5), iVar7 == 0
              )))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_348,"Ignore memcheck: ",0x11);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_348,(pbVar9->_M_dataplus)._M_p,
                                pbVar9->_M_string_length);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x8f5,(char *)local_1a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
LAB_002bb156:
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
            std::ios_base::~ios_base(local_2d8);
            return true;
          }
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar3);
      }
    }
    else if (pbVar9 != pbVar3) {
      sVar4 = pbVar1->_M_string_length;
      do {
        sVar5 = pbVar9->_M_string_length;
        if ((sVar5 == sVar4) &&
           ((sVar5 == 0 ||
            (iVar7 = bcmp((pbVar9->_M_dataplus)._M_p,(pbVar1->_M_dataplus)._M_p,sVar5), iVar7 == 0))
           )) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_348,"Ignore test: ",0xd);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_348,(pbVar9->_M_dataplus)._M_p,
                              pbVar9->_M_string_length);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x909,(char *)local_1a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          goto LAB_002bb156;
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != pbVar3);
    }
    local_348._0_8_ = local_348 + 0x10;
    local_348._8_8_ = 0;
    local_338._M_local_buf[0] = '\0';
    local_328._M_p = (pointer)&local_318;
    local_320 = 0;
    local_318._M_local_buf[0] = '\0';
    local_258._M_color = _S_red;
    local_258._M_parent = (_Base_ptr)0x0;
    memset(local_308,0,0xa8);
    local_238 = 0;
    local_1d0._M_left = &local_1d0;
    local_1d0._M_color = _S_red;
    local_1d0._M_parent = (_Base_ptr)0x0;
    local_208 = (pointer)0x0;
    pbStack_200 = (pointer)0x0;
    local_1f8 = (pointer)0x0;
    pbStack_1f0 = (pointer)0x0;
    local_1e8 = (pointer)0x0;
    pbStack_1e0 = (pointer)0x0;
    local_1b0 = 0;
    local_258._M_left = &local_258;
    local_258._M_right = &local_258;
    local_1d0._M_right = local_1d0._M_left;
    std::__cxx11::string::_M_assign((string *)local_348);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(local_308,args);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_1a8,(SystemTools *)&DAT_00000001,collapse);
    std::__cxx11::string::operator=((string *)&local_328,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Set test directory: ",0x14);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_328._M_p,local_320);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x913,(char *)local_368,(this->super_cmCTestGenericHandler).Quiet);
    if (local_368 != local_358) {
      operator_delete(local_368,local_358[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_230 = 1;
    local_224 = false;
    local_220 = 0.0;
    local_218 = false;
    local_22c._0_4_ = 0.0;
    local_22c._4_4_ = 0;
    local_210._0_4_ = 1;
    local_210._4_4_ = -1;
    if (((this->UseIncludeRegExpFlag == true) &&
        (bVar6 = cmsys::RegularExpression::find
                           (&this->IncludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p), !bVar6
        )) || ((this->UseExcludeRegExpFlag == true &&
               ((this->UseExcludeRegExpFirst == false &&
                (bVar6 = cmsys::RegularExpression::find
                                   (&this->ExcludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p)
                , bVar6)))))) {
      local_230 = local_230 & 0xff00;
    }
    std::
    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
    ::push_back(&this->TestList,(value_type *)local_348);
    cmCTestTestProperties::~cmCTestTestProperties((cmCTestTestProperties *)local_348);
  }
  return true;
}

Assistant:

bool cmCTestTestHandler::AddTest(const std::vector<std::string>& args)
{
  const std::string& testname = args[0];
  cmCTestOptionalLog(this->CTest, DEBUG, "Add test: " << args[0] << std::endl,
    this->Quiet);

  if (this->UseExcludeRegExpFlag &&
    this->UseExcludeRegExpFirst &&
    this->ExcludeTestsRegularExpression.find(testname.c_str()))
    {
    return true;
    }
  if ( this->MemCheck )
    {
    std::vector<std::string>::iterator it;
    bool found = false;
    for ( it = this->CustomTestsIgnore.begin();
      it != this->CustomTestsIgnore.end(); ++ it )
      {
      if ( *it == testname )
        {
        found = true;
        break;
        }
      }
    if ( found )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
        "Ignore memcheck: " << *it << std::endl, this->Quiet);
      return true;
      }
    }
  else
    {
    std::vector<std::string>::iterator it;
    bool found = false;
    for ( it = this->CustomTestsIgnore.begin();
      it != this->CustomTestsIgnore.end(); ++ it )
      {
      if ( *it == testname )
        {
        found = true;
        break;
        }
      }
    if ( found )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Ignore test: "
        << *it << std::endl, this->Quiet);
      return true;
      }
    }

  cmCTestTestProperties test;
  test.Name = testname;
  test.Args = args;
  test.Directory = cmSystemTools::GetCurrentWorkingDirectory();
  cmCTestOptionalLog(this->CTest, DEBUG, "Set test directory: "
    << test.Directory << std::endl, this->Quiet);

  test.IsInBasedOnREOptions = true;
  test.WillFail = false;
  test.RunSerial = false;
  test.Timeout = 0;
  test.ExplicitTimeout = false;
  test.Cost = 0;
  test.Processors = 1;
  test.SkipReturnCode = -1;
  test.PreviousRuns = 0;
  if (this->UseIncludeRegExpFlag &&
    !this->IncludeTestsRegularExpression.find(testname.c_str()))
    {
    test.IsInBasedOnREOptions = false;
    }
  else if (this->UseExcludeRegExpFlag &&
    !this->UseExcludeRegExpFirst &&
    this->ExcludeTestsRegularExpression.find(testname.c_str()))
    {
    test.IsInBasedOnREOptions = false;
    }
  this->TestList.push_back(test);
  return true;
}